

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void decode_tile(AV1Decoder *pbi,ThreadData *td,int tile_row,int tile_col)

{
  AV1_COMMON *cm;
  DecoderCodingBlock *pDVar1;
  DecoderCodingBlock *pDVar2;
  MACROBLOCKD *pMVar3;
  ENTROPY_CONTEXT (*paEVar4) [32];
  int iVar5;
  int num_planes;
  uint value;
  int mi_col;
  int iVar6;
  TileInfo tile_info;
  
  cm = &pbi->common;
  num_planes = (uint)(((pbi->common).seq_params)->monochrome == '\0') * 2 + 1;
  av1_tile_set_row(&tile_info,cm,tile_row);
  av1_tile_set_col(&tile_info,cm,tile_col);
  av1_zero_above_context(cm,(MACROBLOCKD *)td,tile_info.mi_col_start,tile_info.mi_col_end,tile_row);
  av1_reset_loop_filter_delta((MACROBLOCKD *)td,num_planes);
  av1_reset_loop_restoration((MACROBLOCKD *)td,num_planes);
  pDVar1 = &td->dcb;
  iVar6 = tile_info.mi_row_start;
  do {
    if (tile_info.mi_row_end <= iVar6) {
      iVar6 = check_trailing_bits_after_symbol_coder(td->bit_reader);
      value = (uint)(iVar6 != 0);
LAB_008b1cd2:
      aom_merge_corrupted_flag(&(td->dcb).corrupted,value);
      return;
    }
    paEVar4 = (td->dcb).xd.left_entropy_context;
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0x10) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0x11) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0x12) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0x13) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0x14) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0x15) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0x16) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0x17) = '\0';
    paEVar4 = (td->dcb).xd.left_entropy_context;
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0x18) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0x19) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0x1a) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0x1b) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0x1c) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0x1d) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0x1e) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0x1f) = '\0';
    pMVar3 = &(td->dcb).xd;
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 2) + 0) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 2) + 1) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 2) + 2) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 2) + 3) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 2) + 4) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 2) + 5) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 2) + 6) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 2) + 7) = '\0';
    paEVar4 = (td->dcb).xd.left_entropy_context;
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 8) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 9) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 10) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0xb) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0xc) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0xd) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0xe) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 2) + 0xf) = '\0';
    paEVar4 = (td->dcb).xd.left_entropy_context;
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0x10) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0x11) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0x12) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0x13) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0x14) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0x15) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0x16) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0x17) = '\0';
    paEVar4 = (td->dcb).xd.left_entropy_context;
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0x18) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0x19) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0x1a) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0x1b) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0x1c) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0x1d) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0x1e) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0x1f) = '\0';
    pMVar3 = &(td->dcb).xd;
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 1) + 0) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 1) + 1) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 1) + 2) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 1) + 3) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 1) + 4) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 1) + 5) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 1) + 6) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 1) + 7) = '\0';
    paEVar4 = (td->dcb).xd.left_entropy_context;
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 8) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 9) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 10) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0xb) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0xc) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0xd) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0xe) = '\0';
    *(ENTROPY_CONTEXT *)((long)(paEVar4 + 1) + 0xf) = '\0';
    pMVar3 = &(td->dcb).xd;
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0x10) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0x11) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0x12) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0x13) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0x14) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0x15) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0x16) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0x17) = '\0';
    pMVar3 = &(td->dcb).xd;
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0x18) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0x19) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0x1a) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0x1b) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0x1c) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0x1d) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0x1e) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0x1f) = '\0';
    *(ENTROPY_CONTEXT *)((long)((pDVar1->xd).left_entropy_context + 0) + 0) = '\0';
    *(ENTROPY_CONTEXT *)((long)((pDVar1->xd).left_entropy_context + 0) + 1) = '\0';
    *(ENTROPY_CONTEXT *)((long)((pDVar1->xd).left_entropy_context + 0) + 2) = '\0';
    *(ENTROPY_CONTEXT *)((long)((pDVar1->xd).left_entropy_context + 0) + 3) = '\0';
    *(ENTROPY_CONTEXT *)((long)((pDVar1->xd).left_entropy_context + 0) + 4) = '\0';
    *(ENTROPY_CONTEXT *)((long)((pDVar1->xd).left_entropy_context + 0) + 5) = '\0';
    *(ENTROPY_CONTEXT *)((long)((pDVar1->xd).left_entropy_context + 0) + 6) = '\0';
    *(ENTROPY_CONTEXT *)((long)((pDVar1->xd).left_entropy_context + 0) + 7) = '\0';
    pMVar3 = &(td->dcb).xd;
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 8) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 9) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 10) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0xb) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0xc) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0xd) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0xe) = '\0';
    *(ENTROPY_CONTEXT *)((long)(pMVar3->left_entropy_context + 0) + 0xf) = '\0';
    pDVar2 = &td->dcb;
    (pDVar2->xd).left_partition_context[0x10] = '\0';
    (pDVar2->xd).left_partition_context[0x11] = '\0';
    (pDVar2->xd).left_partition_context[0x12] = '\0';
    (pDVar2->xd).left_partition_context[0x13] = '\0';
    (pDVar2->xd).left_partition_context[0x14] = '\0';
    (pDVar2->xd).left_partition_context[0x15] = '\0';
    (pDVar2->xd).left_partition_context[0x16] = '\0';
    (pDVar2->xd).left_partition_context[0x17] = '\0';
    pDVar2 = &td->dcb;
    (pDVar2->xd).left_partition_context[0x18] = '\0';
    (pDVar2->xd).left_partition_context[0x19] = '\0';
    (pDVar2->xd).left_partition_context[0x1a] = '\0';
    (pDVar2->xd).left_partition_context[0x1b] = '\0';
    (pDVar2->xd).left_partition_context[0x1c] = '\0';
    (pDVar2->xd).left_partition_context[0x1d] = '\0';
    (pDVar2->xd).left_partition_context[0x1e] = '\0';
    (pDVar2->xd).left_partition_context[0x1f] = '\0';
    (td->dcb).xd.left_partition_context[0] = '\0';
    (td->dcb).xd.left_partition_context[1] = '\0';
    (td->dcb).xd.left_partition_context[2] = '\0';
    (td->dcb).xd.left_partition_context[3] = '\0';
    (td->dcb).xd.left_partition_context[4] = '\0';
    (td->dcb).xd.left_partition_context[5] = '\0';
    (td->dcb).xd.left_partition_context[6] = '\0';
    (td->dcb).xd.left_partition_context[7] = '\0';
    pDVar2 = &td->dcb;
    (pDVar2->xd).left_partition_context[8] = '\0';
    (pDVar2->xd).left_partition_context[9] = '\0';
    (pDVar2->xd).left_partition_context[10] = '\0';
    (pDVar2->xd).left_partition_context[0xb] = '\0';
    (pDVar2->xd).left_partition_context[0xc] = '\0';
    (pDVar2->xd).left_partition_context[0xd] = '\0';
    (pDVar2->xd).left_partition_context[0xe] = '\0';
    (pDVar2->xd).left_partition_context[0xf] = '\0';
    builtin_memcpy((td->dcb).xd.left_txfm_context_buffer,"@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",0x20);
    for (mi_col = tile_info.mi_col_start; mi_col < tile_info.mi_col_end;
        mi_col = mi_col + ((pbi->common).seq_params)->mib_size) {
      set_cb_buffer(pbi,&td->dcb,&td->cb_buffer_base,num_planes,0,0);
      decode_partition(pbi,td,iVar6,mi_col,td->bit_reader,((pbi->common).seq_params)->sb_size,3);
      iVar5 = aom_reader_has_overflowed(td->bit_reader);
      if (iVar5 != 0) {
        value = 1;
        goto LAB_008b1cd2;
      }
    }
    iVar6 = iVar6 + ((pbi->common).seq_params)->mib_size;
  } while( true );
}

Assistant:

static inline void decode_tile(AV1Decoder *pbi, ThreadData *const td,
                               int tile_row, int tile_col) {
  TileInfo tile_info;

  AV1_COMMON *const cm = &pbi->common;
  const int num_planes = av1_num_planes(cm);

  av1_tile_set_row(&tile_info, cm, tile_row);
  av1_tile_set_col(&tile_info, cm, tile_col);
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;

  av1_zero_above_context(cm, xd, tile_info.mi_col_start, tile_info.mi_col_end,
                         tile_row);
  av1_reset_loop_filter_delta(xd, num_planes);
  av1_reset_loop_restoration(xd, num_planes);

  for (int mi_row = tile_info.mi_row_start; mi_row < tile_info.mi_row_end;
       mi_row += cm->seq_params->mib_size) {
    av1_zero_left_context(xd);

    for (int mi_col = tile_info.mi_col_start; mi_col < tile_info.mi_col_end;
         mi_col += cm->seq_params->mib_size) {
      set_cb_buffer(pbi, dcb, &td->cb_buffer_base, num_planes, 0, 0);

      // Bit-stream parsing and decoding of the superblock
      decode_partition(pbi, td, mi_row, mi_col, td->bit_reader,
                       cm->seq_params->sb_size, 0x3);

      if (aom_reader_has_overflowed(td->bit_reader)) {
        aom_merge_corrupted_flag(&dcb->corrupted, 1);
        return;
      }
    }
  }

  int corrupted =
      (check_trailing_bits_after_symbol_coder(td->bit_reader)) ? 1 : 0;
  aom_merge_corrupted_flag(&dcb->corrupted, corrupted);
}